

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.h
# Opt level: O2

void __thiscall Proxy::Proxy(Proxy *this,CService *_proxy,bool _randomize_credentials)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CService::CService(&this->proxy,_proxy);
  (this->m_unix_socket_path)._M_dataplus._M_p = (pointer)&(this->m_unix_socket_path).field_2;
  (this->m_unix_socket_path)._M_string_length = 0;
  (this->m_unix_socket_path).field_2._M_local_buf[0] = '\0';
  this->m_is_unix_socket = false;
  this->m_randomize_credentials = _randomize_credentials;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit Proxy(const CService& _proxy, bool _randomize_credentials = false) : proxy(_proxy), m_is_unix_socket(false), m_randomize_credentials(_randomize_credentials) {}